

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void lj_asm_patchexit(jit_State *J,GCtrace *T,ExitNo exitno,MCode *target)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  long lVar4;
  jit_State *J_00;
  int in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  intptr_t ofs;
  uint32_t statei;
  MCode *pe;
  MCode *px;
  MSize len;
  MCode *mcarea;
  MCode *p;
  ptrdiff_t delta_1;
  ptrdiff_t delta;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  jit_State *in_stack_ffffffffffffff68;
  jit_State *local_78;
  
  local_78 = *(jit_State **)(in_RSI + 0x40);
  lj_mcode_patch(in_stack_ffffffffffffff68,
                 (MCode *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  uVar1 = *(uint *)(in_RSI + 0x3c);
  lVar4 = *(long *)(in_RDI + 0x680 + (ulong)(in_EDX >> 5) * 8) + (ulong)((in_EDX & 0x1f) << 2) + -6;
  J_00 = (jit_State *)((long)local_78 + ((ulong)uVar1 - 6));
  iVar2 = (int)in_RDI + -0xe8;
  if (((5 < uVar1) &&
      (*(char *)((long)&(local_78->cur).nextgc.gcptr32 + (ulong)(uVar1 - 5)) == -0x17)) &&
     ((long)local_78 + (long)*(int *)((long)local_78 + ((ulong)uVar1 - 4)) + ((ulong)uVar1 - 6) ==
      lVar4)) {
    *(uint *)((long)local_78 + ((ulong)uVar1 - 4)) = in_ECX - ((int)local_78 + uVar1);
  }
  while ((local_78 < J_00 &&
         ((in_stack_ffffffffffffff58 = 0,
          *(int *)((long)&(local_78->cur).nextgc.gcptr32 + 3) != iVar2 ||
          ((char)(local_78->cur).nextgc.gcptr32 != -0x39))))) {
    uVar3 = asm_x86_inslen((uint8_t *)local_78);
    local_78 = (jit_State *)((long)&(local_78->cur).nextgc.gcptr32 + (ulong)uVar3);
  }
  for (; local_78 < J_00;
      local_78 = (jit_State *)((long)&(local_78->cur).nextgc.gcptr32 + (ulong)uVar3)) {
    if ((((local_78->cur).nextgc.gcptr32 & 0xf0ff) == 0x800f) &&
       ((long)&(local_78->cur).nextgc.gcptr32 +
        (long)*(int *)((long)&(local_78->cur).nextgc.gcptr32 + 2) == lVar4)) {
      *(int *)((long)&(local_78->cur).nextgc.gcptr32 + 2) = in_ECX - ((int)local_78 + 6);
    }
    uVar3 = asm_x86_inslen((uint8_t *)local_78);
  }
  lj_mcode_sync(*(void **)(in_RSI + 0x40),
                (void *)(*(long *)(in_RSI + 0x40) + (ulong)*(uint *)(in_RSI + 0x3c)));
  lj_mcode_patch(J_00,(MCode *)CONCAT44(iVar2,in_stack_ffffffffffffff60),
                 (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  return;
}

Assistant:

void lj_asm_patchexit(jit_State *J, GCtrace *T, ExitNo exitno, MCode *target)
{
  MCode *p = T->mcode;
  MCode *mcarea = lj_mcode_patch(J, p, 0);
  MSize len = T->szmcode;
  MCode *px = exitstub_addr(J, exitno) - 6;
  MCode *pe = p+len-6;
#if LJ_GC64
  uint32_t statei = (uint32_t)(GG_OFS(g.vmstate) - GG_OFS(dispatch));
#else
  uint32_t statei = u32ptr(&J2G(J)->vmstate);
#endif
  if (len > 5 && p[len-5] == XI_JMP && p+len-6 + *(int32_t *)(p+len-4) == px)
    *(int32_t *)(p+len-4) = jmprel(J, p+len, target);
  /* Do not patch parent exit for a stack check. Skip beyond vmstate update. */
  for (; p < pe; p += asm_x86_inslen(p)) {
    intptr_t ofs = LJ_GC64 ? (p[0] & 0xf0) == 0x40 : LJ_64;
    if (*(uint32_t *)(p+2+ofs) == statei && p[ofs+LJ_GC64-LJ_64] == XI_MOVmi)
      break;
  }
  lj_assertJ(p < pe, "instruction length decoder failed");
  for (; p < pe; p += asm_x86_inslen(p))
    if ((*(uint16_t *)p & 0xf0ff) == 0x800f && p + *(int32_t *)(p+2) == px)
      *(int32_t *)(p+2) = jmprel(J, p+6, target);
  lj_mcode_sync(T->mcode, T->mcode + T->szmcode);
  lj_mcode_patch(J, mcarea, 1);
}